

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imreadwrite.cpp
# Opt level: O2

bool cv::imwrite(string *path,Mat *m,vector<int,_std::allocator<int>_> *params)

{
  uchar uVar1;
  pointer piVar2;
  bool bVar3;
  int i;
  int iVar4;
  char *pcVar5;
  int in_ECX;
  long lVar6;
  uchar *puVar7;
  void *__child_stack;
  ulong uVar8;
  byte bVar9;
  void *in_R8;
  Mat img;
  string ext;
  
  pcVar5 = strrchr((path->_M_dataplus)._M_p,0x2e);
  if (pcVar5 == (char *)0x0) {
    bVar9 = 0;
    goto LAB_00149243;
  }
  std::__cxx11::string::string((string *)&ext,pcVar5,(allocator *)&img);
  Mat::clone(&img,(__fn *)m,__child_stack,in_ECX,in_R8);
  if (img.c == 1) {
LAB_00149105:
    bVar3 = std::operator==(&ext,".jpg");
    if ((((bVar3) || (bVar3 = std::operator==(&ext,".jpeg"), bVar3)) ||
        (bVar3 = std::operator==(&ext,".JPG"), bVar3)) ||
       (bVar3 = std::operator==(&ext,".JPEG"), bVar3)) {
      piVar2 = (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = 0x5f;
      for (uVar8 = 0;
          uVar8 < (ulong)((long)(params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
          uVar8 = uVar8 + 2) {
        if (piVar2[uVar8] == 1) {
          iVar4 = piVar2[uVar8 + 1];
          break;
        }
      }
      iVar4 = stbi_write_jpg((path->_M_dataplus)._M_p,img.cols,img.rows,img.c,img.data,iVar4);
      bVar9 = (byte)iVar4;
    }
    else {
      bVar3 = std::operator==(&ext,".png");
      if ((bVar3) || (bVar3 = std::operator==(&ext,".PNG"), bVar3)) {
        iVar4 = stbi_write_png((path->_M_dataplus)._M_p,img.cols,img.rows,img.c,img.data,0);
        bVar9 = (byte)iVar4;
      }
      else {
        bVar3 = std::operator==(&ext,".bmp");
        if ((!bVar3) && (bVar3 = std::operator==(&ext,".BMP"), !bVar3)) goto LAB_0014922d;
        iVar4 = stbi_write_bmp((path->_M_dataplus)._M_p,img.cols,img.rows,img.c,img.data);
        bVar9 = (byte)iVar4;
      }
    }
  }
  else {
    if (img.c == 3) {
      puVar7 = img.data;
      for (iVar4 = 0; iVar4 < img.rows * img.cols; iVar4 = iVar4 + 1) {
        uVar1 = *puVar7;
        *puVar7 = puVar7[2];
        puVar7[2] = uVar1;
        puVar7 = puVar7 + 3;
      }
      goto LAB_00149105;
    }
    if (img.c == 4) {
      for (lVar6 = 0; (int)lVar6 < img.rows * img.cols; lVar6 = lVar6 + 1) {
        uVar1 = img.data[lVar6 * 4];
        img.data[lVar6 * 4] = img.data[lVar6 * 4 + 2];
        img.data[lVar6 * 4 + 2] = uVar1;
      }
      goto LAB_00149105;
    }
LAB_0014922d:
    bVar9 = 0;
  }
  Mat::~Mat(&img);
  std::__cxx11::string::~string((string *)&ext);
LAB_00149243:
  return (bool)(bVar9 & 1);
}

Assistant:

bool imwrite(const std::string& path, const Mat& m, const std::vector<int>& params)
{
    const char* _ext = strrchr(path.c_str(), '.');
    if (!_ext)
    {
        // missing extension
        return false;
    }

    std::string ext = _ext;
    Mat img = m.clone();

    // bgr to rgb
    int c = 0;
    if (img.type() == CV_8UC1)
    {
        c = 1;
    }
    else if (img.type() == CV_8UC3)
    {
        c = 3;
        uchar* p = img.data;
        for (int i = 0; i < img.cols * img.rows; i++)
        {
            std::swap(p[0], p[2]);
            p += 3;
        }
    }
    else if (img.type() == CV_8UC4)
    {
        c = 4;
        uchar* p = img.data;
        for (int i = 0; i < img.cols * img.rows; i++)
        {
            std::swap(p[0], p[2]);
            p += 4;
        }
    }
    else
    {
        // unexpected image channels
        return false;
    }

    bool success = false;

    if (ext == ".jpg" || ext == ".jpeg" || ext == ".JPG" || ext == ".JPEG")
    {
        int quality = 95;
        for (size_t i = 0; i < params.size(); i += 2)
        {
            if (params[i] == IMWRITE_JPEG_QUALITY)
            {
                quality = params[i + 1];
                break;
            }
        }
        success = stbi_write_jpg(path.c_str(), img.cols, img.rows, c, img.data, quality);
    }
    else if (ext == ".png" || ext == ".PNG")
    {
        success = stbi_write_png(path.c_str(), img.cols, img.rows, c, img.data, 0);
    }
    else if (ext == ".bmp" || ext == ".BMP")
    {
        success = stbi_write_bmp(path.c_str(), img.cols, img.rows, c, img.data);
    }
    else
    {
        // unknown extension type
        return false;
    }

    return success;
}